

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O1

string * __thiscall
gl4cts::ShaderSubroutine::FunctionalTest17::getVertexShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,FunctionalTest17 *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "#version 400\n\n#extension GL_ARB_shader_subroutine : require\n\nout VS_DATA\n{\n    vec4 vs_data;\n} result;\n\nsubroutine void subroutineTypeVS(out vec4 result);\n\nsubroutine(subroutineTypeVS) void subroutine1(out vec4 result)\n{\n    result = vec4(1, 2, 3, 4);\n}\n\nsubroutine uniform subroutineTypeVS function;\n\nvoid main()\n{\n    function(result.vs_data);\n}\n"
             ,"");
  return __return_storage_ptr__;
}

Assistant:

std::string FunctionalTest17::getVertexShaderBody() const
{
	return "#version 400\n"
		   "\n"
		   "#extension GL_ARB_shader_subroutine : require\n"
		   "\n"
		   "out VS_DATA\n"
		   "{\n"
		   "    vec4 vs_data;\n"
		   "} result;\n"
		   "\n"
		   "subroutine void subroutineTypeVS(out vec4 result);\n"
		   "\n"
		   "subroutine(subroutineTypeVS) void subroutine1(out vec4 result)\n"
		   "{\n"
		   "    result = vec4(1, 2, 3, 4);\n"
		   "}\n"
		   "\n"
		   "subroutine uniform subroutineTypeVS function;\n"
		   "\n"
		   "void main()\n"
		   "{\n"
		   "    function(result.vs_data);\n"
		   "}\n";
}